

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O2

size_t derSIDDec(char *oid,u32 val)

{
  ulong uVar1;
  uint uVar2;
  u32 t;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  lVar4 = -1;
  uVar2 = val;
  do {
    lVar3 = lVar4;
    lVar4 = lVar3 + 1;
    bVar5 = 9 < uVar2;
    uVar2 = uVar2 / 10;
  } while (bVar5);
  if (oid != (char *)0x0) {
    do {
      uVar1 = (ulong)val;
      val = val / 10;
      oid[lVar4] = (byte)(uVar1 % 10) | 0x30;
      bVar5 = lVar4 != 0;
      lVar4 = lVar4 + -1;
    } while (bVar5);
  }
  return lVar3 + 2;
}

Assistant:

static size_t derSIDDec(char* oid, u32 val)
{
	size_t count = 0, pos;
	u32 t = val;
	// число символов для val
	do
		t /= 10, count++;
	while (t > 0);
	// декодирование
	if (oid)
	{
		ASSERT(memIsValid(oid, count));
		pos = count - 1;
		oid[pos] = (t = val) % 10 + '0';
		while (pos--)
			t /= 10, oid[pos] = t % 10 + '0';
	}
	return count;
}